

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

void RigidBodyDynamics::Math::SpatialMatrixSetSubmatrix
               (SpatialMatrix *dest,uint row,uint col,Matrix3d *matrix)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *this;
  
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x6a2a67);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2a8d);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2aaa);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2ad3);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2af0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2b19);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2b36);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2b5f);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2b7b);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2ba7);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2bc5);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2bf1);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2c0e);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2c37);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2c55);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2c81);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)this,
                      in_stack_ffffffffffffff98,0x6a2c9d);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x6a2cc9);
  *pSVar3 = dVar1;
  return;
}

Assistant:

RBDL_DLLAPI void SpatialMatrixSetSubmatrix(
    SpatialMatrix &dest, 
    unsigned int row, 
    unsigned int col, 
    const Matrix3d &matrix) {
  assert (row < 2 && col < 2);

  dest(row*3,col*3) = matrix(0,0);
  dest(row*3,col*3 + 1) = matrix(0,1);
  dest(row*3,col*3 + 2) = matrix(0,2);

  dest(row*3 + 1,col*3) = matrix(1,0);
  dest(row*3 + 1,col*3 + 1) = matrix(1,1);
  dest(row*3 + 1,col*3 + 2) = matrix(1,2);

  dest(row*3 + 2,col*3) = matrix(2,0);
  dest(row*3 + 2,col*3 + 1) = matrix(2,1);
  dest(row*3 + 2,col*3 + 2) = matrix(2,2);
}